

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::AppendCustomCommandSideEffects
          (cmGeneratorTarget *this,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *sideEffects)

{
  pointer pAVar1;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar2;
  cmCustomCommand *pcVar3;
  AllConfigSource *source;
  pointer pAVar4;
  cmGeneratorTarget *local_28;
  
  pvVar2 = cmTarget::GetPreBuildCommands(this->Target);
  if ((((pvVar2->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (pvVar2->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
        super__Vector_impl_data._M_finish) &&
      (pvVar2 = cmTarget::GetPreLinkCommands(this->Target),
      (pvVar2->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (pvVar2->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
      super__Vector_impl_data._M_finish)) &&
     (pvVar2 = cmTarget::GetPostBuildCommands(this->Target),
     (pvVar2->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
     super__Vector_impl_data._M_start ==
     (pvVar2->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
     super__Vector_impl_data._M_finish)) {
    if ((this->AllConfigSources).
        super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->AllConfigSources).
        super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ComputeAllConfigSources(this);
    }
    pAVar4 = (this->AllConfigSources).
             super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pAVar1 = (this->AllConfigSources).
             super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      if (pAVar4 == pAVar1) {
        return;
      }
      pcVar3 = cmSourceFile::GetCustomCommand(pAVar4->Source);
      if (pcVar3 != (cmCustomCommand *)0x0) break;
      pAVar4 = pAVar4 + 1;
    }
  }
  local_28 = this;
  std::
  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
  ::_M_insert_unique<cmGeneratorTarget_const*>
            ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
              *)sideEffects,&local_28);
  return;
}

Assistant:

void cmGeneratorTarget::AppendCustomCommandSideEffects(
  std::set<cmGeneratorTarget const*>& sideEffects) const
{
  if (!this->GetPreBuildCommands().empty() ||
      !this->GetPreLinkCommands().empty() ||
      !this->GetPostBuildCommands().empty()) {
    sideEffects.insert(this);
  } else {
    for (auto const& source : this->GetAllConfigSources()) {
      if (source.Source->GetCustomCommand() != nullptr) {
        sideEffects.insert(this);
        break;
      }
    }
  }
}